

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1b575::CpuTest_rol_a_c_set_clears_c_and_z_flags_Test::
~CpuTest_rol_a_c_set_clears_c_and_z_flags_Test(CpuTest_rol_a_c_set_clears_c_and_z_flags_Test *this)

{
  n_e_s::core::test::CpuTest::~CpuTest(&this->super_CpuTest);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuTest, rol_a_c_set_clears_c_and_z_flags) {
    stage_instruction(ROL_ACC);
    registers.a = 0b00000000;
    registers.p = C_FLAG;
    expected.a = 0b00000001;
    expected.p = 0;

    step_execution(2);
    EXPECT_EQ(expected, registers);
}